

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

void __thiscall winmd::reader::RetTypeSig::~RetTypeSig(RetTypeSig *this)

{
  std::_Optional_payload_base<winmd::reader::TypeSig>::_M_reset
            ((_Optional_payload_base<winmd::reader::TypeSig> *)&this->m_type);
  std::_Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>::
  ~_Vector_base((_Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                 *)this);
  return;
}

Assistant:

RetTypeSig(table_base const* table, byte_view& data)
            : m_cmod(parse_cmods(table, data))
            , m_byref(is_by_ref(data))
        {
            auto cursor = data;
            auto element_type = uncompress_enum<ElementType>(cursor);
            if (element_type == ElementType::Void)
            {
                data = cursor;
            }
            else
            {
                m_type.emplace(table, data);
            }
        }